

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

bool camp::test::array::greater_than_or_equal(void)

{
  bool bVar1;
  array<int,_2UL> b;
  array<int,_2UL> a;
  array<int,_2UL> local_10;
  array<int,_2UL> local_8;
  
  local_8.elements[0] = 1;
  local_8.elements[1] = 2;
  local_10.elements[0] = 1;
  local_10.elements[1] = 3;
  bVar1 = operator>=(&local_8,&local_8);
  if ((bVar1) && (bVar1 = operator>=(&local_10,&local_8), bVar1)) {
    bVar1 = operator>=(&local_8,&local_10);
    return !bVar1;
  }
  return false;
}

Assistant:

CAMP_TEST_BEGIN(array, greater_than_or_equal)
{
   camp::array<int, 2> a{1, 2};
   camp::array<int, 2> b{1, 3};

   return a >= a &&
          b >= a &&
          !(a >= b);
}